

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O2

void __thiscall
cbtAlignedObjectArray<cbtIndexedMesh>::push_back
          (cbtAlignedObjectArray<cbtIndexedMesh> *this,cbtIndexedMesh *_Val)

{
  int *piVar1;
  cbtIndexedMesh *pcVar2;
  uchar *puVar3;
  uchar *puVar4;
  uchar *puVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  cbtIndexedMesh *pcVar8;
  int iVar9;
  undefined4 uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  
  iVar13 = this->m_size;
  if (iVar13 == this->m_capacity) {
    iVar14 = 1;
    if (iVar13 != 0) {
      iVar14 = iVar13 * 2;
    }
    reserve(this,iVar14);
    iVar13 = this->m_size;
  }
  iVar9 = _Val->m_numTriangles;
  uVar10 = *(undefined4 *)&_Val->field_0x4;
  puVar3 = _Val->m_triangleIndexBase;
  iVar11 = _Val->m_triangleIndexStride;
  iVar12 = _Val->m_numVertices;
  puVar4 = _Val->m_vertexBase;
  iVar14 = _Val->m_numVertices;
  puVar5 = _Val->m_vertexBase;
  uVar6 = *(undefined8 *)&_Val->m_vertexStride;
  uVar7 = *(undefined8 *)&_Val->m_vertexType;
  pcVar2 = this->m_data;
  pcVar8 = pcVar2 + iVar13;
  piVar1 = &pcVar8->m_triangleIndexStride;
  pcVar8->m_triangleIndexStride = _Val->m_triangleIndexStride;
  pcVar8->m_numVertices = iVar14;
  *(uchar **)(piVar1 + 2) = puVar5;
  *(undefined8 *)(piVar1 + 4) = uVar6;
  *(undefined8 *)(piVar1 + 6) = uVar7;
  pcVar2 = pcVar2 + iVar13;
  pcVar2->m_numTriangles = iVar9;
  *(undefined4 *)&pcVar2->field_0x4 = uVar10;
  pcVar2->m_triangleIndexBase = puVar3;
  pcVar2->m_triangleIndexStride = iVar11;
  pcVar2->m_numVertices = iVar12;
  pcVar2->m_vertexBase = puVar4;
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

SIMD_FORCE_INLINE void push_back(const T& _Val)
	{
		const int sz = size();
		if (sz == capacity())
		{
			reserve(allocSize(size()));
		}

#ifdef BT_USE_PLACEMENT_NEW
		new (&m_data[m_size]) T(_Val);
#else
		m_data[size()] = _Val;
#endif  //BT_USE_PLACEMENT_NEW

		m_size++;
	}